

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zero_copy_stream_impl_lite.cc
# Opt level: O1

void __thiscall google::protobuf::io::StringOutputStream::BackUp(StringOutputStream *this,int count)

{
  LogMessage *pLVar1;
  LogFinisher local_d1;
  LogMessage local_d0;
  LogMessage local_98;
  LogMessage local_60;
  
  if (count < 0) {
    internal::LogMessage::LogMessage
              (&local_60,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/io/zero_copy_stream_impl_lite.cc"
               ,0xbf);
    pLVar1 = internal::LogMessage::operator<<(&local_60,"CHECK failed: (count) >= (0): ");
    internal::LogFinisher::operator=((LogFinisher *)&local_98,pLVar1);
    internal::LogMessage::~LogMessage(&local_60);
  }
  if (this->target_ == (string *)0x0) {
    internal::LogMessage::LogMessage
              (&local_98,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/io/zero_copy_stream_impl_lite.cc"
               ,0xc0);
    pLVar1 = internal::LogMessage::operator<<(&local_98,"CHECK failed: target_ != NULL: ");
    internal::LogFinisher::operator=((LogFinisher *)&local_d0,pLVar1);
    internal::LogMessage::~LogMessage(&local_98);
  }
  if (this->target_->_M_string_length < (ulong)(long)count) {
    internal::LogMessage::LogMessage
              (&local_d0,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/io/zero_copy_stream_impl_lite.cc"
               ,0xc1);
    pLVar1 = internal::LogMessage::operator<<
                       (&local_d0,"CHECK failed: (count) <= (target_->size()): ");
    internal::LogFinisher::operator=(&local_d1,pLVar1);
    internal::LogMessage::~LogMessage(&local_d0);
  }
  std::__cxx11::string::resize
            ((ulong)this->target_,(char)this->target_->_M_string_length - (char)count);
  return;
}

Assistant:

void StringOutputStream::BackUp(int count) {
  GOOGLE_CHECK_GE(count, 0);
  GOOGLE_CHECK(target_ != NULL);
  GOOGLE_CHECK_LE(count, target_->size());
  target_->resize(target_->size() - count);
}